

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chibicc_parse.c
# Opt level: O0

C_Type * struct_union_decl(C_Parser *parser,C_Token **rest,C_Token *tok)

{
  _Bool _Var1;
  C_Parser *ty_00;
  C_Token *pCVar2;
  C_Type *ty2_1;
  C_Type *ty2;
  C_Token *tag;
  C_Type *ty;
  C_Token *tok_local;
  C_Token **rest_local;
  C_Parser *parser_local;
  
  ty = (C_Type *)tok;
  tok_local = (C_Token *)rest;
  rest_local = (C_Token **)parser;
  ty_00 = (C_Parser *)C_struct_type(parser);
  pCVar2 = attribute_list((C_Parser *)rest_local,(C_Token *)ty,(C_Type *)ty_00);
  ty2 = (C_Type *)0x0;
  ty = (C_Type *)pCVar2;
  if (pCVar2->kind == TK_IDENT) {
    ty = (C_Type *)pCVar2->next;
    ty2 = (C_Type *)pCVar2;
  }
  if ((ty2 == (C_Type *)0x0) || (_Var1 = C_equal((C_Token *)ty,"{"), _Var1)) {
    ty = (C_Type *)C_skip((C_Parser *)rest_local,(C_Token *)ty,"{");
    struct_members((C_Parser *)rest_local,(C_Token **)&ty,(C_Token *)ty,(C_Type *)ty_00);
    pCVar2 = attribute_list((C_Parser *)rest_local,(C_Token *)ty,(C_Type *)ty_00);
    *(C_Token **)tok_local = pCVar2;
    parser_local = ty_00;
    if (ty2 != (C_Type *)0x0) {
      parser_local = (C_Parser *)
                     hashmap_get2((HashMap *)&rest_local[6]->fval,*(char **)&ty2->array_len,
                                  *(int *)&ty2->vla_len);
      if (parser_local == (C_Parser *)0x0) {
        push_tag_scope((C_Parser *)rest_local,(C_Token *)ty2,(C_Type *)ty_00);
        parser_local = ty_00;
      }
      else {
        memcpy(parser_local,ty_00,0x78);
      }
    }
  }
  else {
    *(C_Type **)tok_local = ty;
    parser_local = (C_Parser *)find_tag((C_Parser *)rest_local,(C_Token *)ty2);
    if (parser_local == (C_Parser *)0x0) {
      *(int *)&ty_00->field_0x4 = -1;
      push_tag_scope((C_Parser *)rest_local,(C_Token *)ty2,(C_Type *)ty_00);
      parser_local = ty_00;
    }
  }
  return (C_Type *)parser_local;
}

Assistant:

static C_Type *struct_union_decl(C_Parser *parser, C_Token **rest, C_Token *tok) {
  C_Type *ty = C_struct_type(parser);
  tok = attribute_list(parser, tok, ty);

  // Read a tag.
  C_Token *tag = NULL;
  if (tok->kind == TK_IDENT) {
    tag = tok;
    tok = tok->next;
  }

  if (tag && !C_equal(tok, "{")) {
    *rest = tok;

    C_Type *ty2 = find_tag(parser, tag);
    if (ty2)
      return ty2;

    ty->size = -1;
    push_tag_scope(parser, tag, ty);
    return ty;
  }

  tok = C_skip(parser, tok, "{");

  // Construct a struct object.
  struct_members(parser, &tok, tok, ty);
  *rest = attribute_list(parser, tok, ty);

  if (tag) {
    // If this is a redefinition, overwrite a previous type.
    // Otherwise, register the struct type.
    C_Type *ty2 = hashmap_get2(&parser->scope->tags, tag->loc, tag->len);
    if (ty2) {
      *ty2 = *ty;
      return ty2;
    }

    push_tag_scope(parser, tag, ty);
  }

  return ty;
}